

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::printAssignmentSyntax(PrinterStream *this,Expression *e)

{
  CodePrinter *this_00;
  char *s;
  
  this_00 = this->out;
  s = getAssignmentRole(this,e);
  choc::text::CodePrinter::operator<<(this_00,s);
  printExpression(this,e);
  choc::text::CodePrinter::operator<<(this->out," = ");
  return;
}

Assistant:

void printAssignmentSyntax (heart::Expression& e)
        {
            out << getAssignmentRole (e);
            printExpression (e);
            out << " = ";
        }